

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

void __thiscall
wasm::WasmBinaryWriter::writeDebugLocation(WasmBinaryWriter *this,Expression *curr,Function *func)

{
  int iVar1;
  int iVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  Expression *local_28;
  Expression *curr_local;
  
  local_28 = curr;
  if (this->sourceMap != (ostream *)0x0) {
    iVar3 = std::
            _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(func->debugLocations)._M_h,&local_28);
    if (iVar3.
        super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_false>
        ._M_cur != (__node_type *)0x0) {
      writeDebugLocation(this,(DebugLocation *)
                              ((long)iVar3.
                                     super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_false>
                                     ._M_cur + 0x10));
    }
  }
  if ((func != (Function *)0x0) && ((func->expressionLocations)._M_h._M_element_count != 0)) {
    iVar1 = *(int *)&(this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
    iVar2 = *(int *)&(this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
    pmVar4 = std::__detail::
             _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->binaryLocations,&local_28);
    pmVar4->start = iVar1 - iVar2;
    pmVar4->end = 0;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (&this->binaryLocationTrackedExpressionsForFunc,&local_28);
  }
  return;
}

Assistant:

void WasmBinaryWriter::writeDebugLocation(Expression* curr, Function* func) {
  if (sourceMap) {
    auto& debugLocations = func->debugLocations;
    auto iter = debugLocations.find(curr);
    if (iter != debugLocations.end()) {
      writeDebugLocation(iter->second);
    }
  }
  // If this is an instruction in a function, and if the original wasm had
  // binary locations tracked, then track it in the output as well.
  if (func && !func->expressionLocations.empty()) {
    binaryLocations.expressions[curr] =
      BinaryLocations::Span{BinaryLocation(o.size()), 0};
    binaryLocationTrackedExpressionsForFunc.push_back(curr);
  }
}